

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

QByteArray * __thiscall ProString::toLatin1(QByteArray *__return_storage_ptr__,ProString *this)

{
  CutResult CVar1;
  storage_type_conflict *psVar2;
  long in_FS_OFFSET;
  QStringView QVar3;
  storage_type_conflict *local_28;
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (long)this->m_offset;
  local_28 = (storage_type_conflict *)(long)this->m_length;
  CVar1 = QtPrivate::QContainerImplHelper::mid
                    ((this->m_string).d.size,&local_20,(qsizetype *)&local_28);
  psVar2 = local_28;
  if (CVar1 == Null) {
    psVar2 = (storage_type_conflict *)0x0;
  }
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)__return_storage_ptr__;
  QtPrivate::convertToLatin1(QVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray toLatin1() const { return toQStringView().toLatin1(); }